

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

int PosixMemalign(void **ptr,size_t align,size_t size)

{
  size_t local_30;
  int local_24;
  
  local_30 = size;
  (*noopt_helper)(&local_30);
  local_24 = posix_memalign(ptr,align,local_30);
  (*noopt_helper)(&local_24);
  return local_24;
}

Assistant:

static inline int PosixMemalign(void** ptr, size_t align, size_t size) {
  return noopt(posix_memalign(ptr, align, noopt(size)));
}